

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

parser_error parse_entry_label(parser *p)

{
  long *plVar1;
  char *src;
  wchar_t *dest;
  size_t sVar2;
  size_t sVar3;
  parser_error pVar4;
  
  plVar1 = (long *)parser_priv(p);
  if (plVar1 == (long *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    src = parser_getstr(p,"label");
    mem_free(*(void **)(*plVar1 + 0x20));
    dest = (wchar_t *)mem_alloc(0x144);
    *(wchar_t **)(*plVar1 + 0x20) = dest;
    sVar2 = text_mbstowcs(dest,src,L'P');
    pVar4 = PARSE_ERROR_INVALID_VALUE;
    if (sVar2 != 0xffffffffffffffff) {
      sVar3 = text_mbstowcs((wchar_t *)(sVar2 * 4 + *(long *)(*plVar1 + 0x20)),"",L'\x01');
      if (sVar3 != 0xffffffffffffffff) {
        *(int *)(*plVar1 + 0x1a4) = (int)sVar2;
        pVar4 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_entry_label(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	size_t nw;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "label");
	mem_free(embryo->entry->label);
	embryo->entry->label = mem_alloc((MAX_ENTRY_LABEL + 1) *
		sizeof(*embryo->entry->label));
	nw = text_mbstowcs(embryo->entry->label, name, MAX_ENTRY_LABEL);
	if (nw != (size_t)-1) {
		/* Ensure null termination. */
		size_t nw2 = text_mbstowcs(embryo->entry->label + nw, "", 1);

		if (nw2 != (size_t)-1) {
			embryo->entry->nlabel = nw;
		} else {
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}